

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

iterator __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
          (intrusive_list<(anonymous_namespace)::TestObject> *this,iterator pos,
          unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
          *node)

{
  pointer pTVar1;
  pointer pTVar2;
  reference pTVar3;
  bool bVar4;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_58;
  iterator local_50;
  pointer local_40;
  TestObject *node_p;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  *node_local;
  intrusive_list<(anonymous_namespace)::TestObject> *this_local;
  iterator pos_local;
  
  pos_local.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)pos.node_;
  this_local = pos.list_;
  node_p = (TestObject *)node;
  node_local = (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                *)this;
  pTVar1 = std::
           unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
           ::operator->(node);
  bVar4 = false;
  if ((pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
      (TestObject *)0x0) {
    pTVar1 = std::
             unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
             ::operator->(node);
    bVar4 = (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
            (TestObject *)0x0;
  }
  if (!bVar4) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x205,
                  "typename intrusive_list<T>::iterator wabt::intrusive_list<(anonymous namespace)::TestObject>::insert(iterator, std::unique_ptr<T>) [T = (anonymous namespace)::TestObject]"
                 );
  }
  local_50 = end(this);
  bVar4 = iterator::operator==((iterator *)&this_local,local_50);
  if (bVar4) {
    std::
    unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
    ::unique_ptr(&local_58,node);
    push_back(this,&local_58);
    std::
    unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
    ::~unique_ptr(&local_58);
    local_40 = back(this);
  }
  else {
    local_40 = std::
               unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
               ::release(node);
    pTVar2 = iterator::operator->((iterator *)&this_local);
    (local_40->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
         (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    pTVar3 = iterator::operator*((iterator *)&this_local);
    (local_40->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar3;
    pTVar2 = iterator::operator->((iterator *)&this_local);
    pTVar1 = local_40;
    if ((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
        (TestObject *)0x0) {
      this->first_ = local_40;
    }
    else {
      pTVar2 = iterator::operator->((iterator *)&this_local);
      (((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_)->
      super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar1;
    }
    pTVar1 = local_40;
    pTVar2 = iterator::operator->((iterator *)&this_local);
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar1;
    this->size_ = this->size_ + 1;
  }
  iterator::iterator((iterator *)&pos_local.node_,this,local_40);
  return stack0xffffffffffffffe8;
}

Assistant:

inline typename intrusive_list<T>::iterator intrusive_list<T>::insert(
    iterator pos,
    std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p;
  if (pos == end()) {
    push_back(std::move(node));
    node_p = &back();
  } else {
    node_p = node.release();
    node_p->prev_ = pos->prev_;
    node_p->next_ = &*pos;
    if (pos->prev_) {
      pos->prev_->next_ = node_p;
    } else {
      first_ = node_p;
    }
    pos->prev_ = node_p;
    size_++;
  }
  return iterator(*this, node_p);
}